

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O3

Function * __thiscall spvtools::opt::IRContext::GetFunction(IRContext *this,uint32_t id)

{
  iterator iVar1;
  Function *pFVar2;
  uint32_t local_c;
  
  local_c = id;
  if ((this->valid_analyses_ & kAnalysisIdToFuncMapping) == kAnalysisNone) {
    BuildIdToFuncMapping(this);
  }
  iVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Function_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->id_to_func_)._M_h,&local_c);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Function_*>,_false>.
      _M_cur == (__node_type *)0x0) {
    pFVar2 = (Function *)0x0;
  }
  else {
    pFVar2 = *(Function **)
              ((long)iVar1.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Function_*>,_false>
                     ._M_cur + 0x10);
  }
  return pFVar2;
}

Assistant:

Function* GetFunction(uint32_t id) {
    if (!AreAnalysesValid(kAnalysisIdToFuncMapping)) {
      BuildIdToFuncMapping();
    }
    auto entry = id_to_func_.find(id);
    return (entry != id_to_func_.end()) ? entry->second : nullptr;
  }